

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlDebugDumpString(FILE *output,xmlChar *str)

{
  byte bVar1;
  uint __c;
  size_t __size;
  char *__ptr;
  long lVar2;
  
  if (output == (FILE *)0x0) {
    output = (FILE *)_stdout;
  }
  if (str == (xmlChar *)0x0) {
    __ptr = "(NULL)";
    __size = 6;
  }
  else {
    lVar2 = 0;
    do {
      bVar1 = str[lVar2];
      if (bVar1 == 0x20) {
LAB_00163c32:
        __c = 0x20;
LAB_00163c37:
        fputc(__c,(FILE *)output);
      }
      else {
        __c = (uint)bVar1;
        if (bVar1 == 0) {
          return;
        }
        if (((byte)(bVar1 - 9) < 2) || (__c == 0xd)) goto LAB_00163c32;
        if (-1 < (char)bVar1) goto LAB_00163c37;
        fprintf((FILE *)output,"#%X");
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x28);
    __ptr = "...";
    __size = 3;
  }
  fwrite(__ptr,__size,1,(FILE *)output);
  return;
}

Assistant:

void
xmlDebugDumpString(FILE * output, const xmlChar * str)
{
    int i;

    if (output == NULL)
	output = stdout;
    if (str == NULL) {
        fprintf(output, "(NULL)");
        return;
    }
    for (i = 0; i < 40; i++)
        if (str[i] == 0)
            return;
        else if (IS_BLANK_CH(str[i]))
            fputc(' ', output);
        else if (str[i] >= 0x80)
            fprintf(output, "#%X", str[i]);
        else
            fputc(str[i], output);
    fprintf(output, "...");
}